

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBarBuf.c
# Opt level: O1

Abc_Ntk_t * Abc_NtkBarBufsToBuffers(Abc_Ntk_t *pNtk)

{
  int iVar1;
  void **ppvVar2;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *__ptr;
  Abc_Ntk_t *pNtk_00;
  char *pcVar3;
  Abc_Obj_t *pObj_00;
  long lVar4;
  long lVar5;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcBarBuf.c"
                  ,0x1ae,"Abc_Ntk_t *Abc_NtkBarBufsToBuffers(Abc_Ntk_t *)");
  }
  if (pNtk->pDesign != (Abc_Des_t *)0x0) {
    __assert_fail("pNtk->pDesign == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcBarBuf.c"
                  ,0x1af,"Abc_Ntk_t *Abc_NtkBarBufsToBuffers(Abc_Ntk_t *)");
  }
  if (pNtk->nBarBufs < 1) {
    __assert_fail("pNtk->nBarBufs > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcBarBuf.c"
                  ,0x1b0,"Abc_Ntk_t *Abc_NtkBarBufsToBuffers(Abc_Ntk_t *)");
  }
  if (pNtk->nBarBufs != pNtk->nObjCounts[8]) {
    __assert_fail("pNtk->nBarBufs == Abc_NtkLatchNum(pNtk)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcBarBuf.c"
                  ,0x1b1,"Abc_Ntk_t *Abc_NtkBarBufsToBuffers(Abc_Ntk_t *)");
  }
  __ptr = Abc_NtkToBarBufsCollect(pNtk);
  pNtk_00 = Abc_NtkAlloc(ABC_NTK_LOGIC,pNtk->ntkFunc,1);
  pcVar3 = Extra_UtilStrsav(pNtk->pName);
  pNtk_00->pName = pcVar3;
  pcVar3 = Extra_UtilStrsav(pNtk->pSpec);
  pNtk_00->pSpec = pcVar3;
  Abc_NtkCleanCopy(pNtk);
  iVar1 = __ptr->nSize;
  if (0 < (long)iVar1) {
    ppvVar2 = __ptr->pArray;
    lVar4 = 0;
    do {
      pObj = (Abc_Obj_t *)ppvVar2[lVar4];
      switch(*(uint *)&pObj->field_0x14 & 0xf) {
      case 2:
        Abc_NtkDupObj(pNtk_00,pObj,1);
        break;
      case 3:
        pObj_00 = Abc_NtkDupObj(pNtk_00,pObj,1);
        goto LAB_001c1372;
      case 4:
      case 5:
        pObj->field_6 =
             *(anon_union_8_4_617c9805_for_Abc_Obj_t__17 *)
              ((long)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray] + 0x40);
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abc/abcBarBuf.c"
                      ,0x1c9,"Abc_Ntk_t *Abc_NtkBarBufsToBuffers(Abc_Ntk_t *)");
      case 7:
        Abc_NtkDupObj(pNtk_00,pObj,1);
        if (0 < (pObj->vFanins).nSize) {
          lVar5 = 0;
          do {
            Abc_ObjAddFanin((pObj->field_6).pCopy,
                            *(Abc_Obj_t **)
                             ((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar5]] + 0x40)
                           );
            lVar5 = lVar5 + 1;
          } while (lVar5 < (pObj->vFanins).nSize);
        }
        break;
      case 8:
        pObj_00 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_NODE);
        (pObj->field_6).pCopy = pObj_00;
LAB_001c1372:
        Abc_ObjAddFanin(pObj_00,*(Abc_Obj_t **)
                                 ((long)pObj->pNtk->vObjs->pArray[*(pObj->vFanins).pArray] + 0x40));
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != iVar1);
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
    __ptr->pArray = (void **)0x0;
  }
  if (__ptr != (Vec_Ptr_t *)0x0) {
    free(__ptr);
  }
  return pNtk_00;
}

Assistant:

Abc_Ntk_t * Abc_NtkBarBufsToBuffers( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pObj, * pFanin;
    int i, k;
    assert( Abc_NtkIsLogic(pNtk) );
    assert( pNtk->pDesign == NULL );
    assert( pNtk->nBarBufs > 0 );
    assert( pNtk->nBarBufs == Abc_NtkLatchNum(pNtk) );
    vNodes = Abc_NtkToBarBufsCollect( pNtk );
    // start the network
    pNtkNew = Abc_NtkAlloc( ABC_NTK_LOGIC, pNtk->ntkFunc, 1 );
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // create objects
    Abc_NtkCleanCopy( pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        if ( Abc_ObjIsPi(pObj) )
            Abc_NtkDupObj( pNtkNew, pObj, 1 );
        else if ( Abc_ObjIsPo( pObj) )
            Abc_ObjAddFanin( Abc_NtkDupObj(pNtkNew, pObj, 1), Abc_ObjFanin0(pObj)->pCopy );
        else if ( Abc_ObjIsBi(pObj) || Abc_ObjIsBo(pObj) )
            pObj->pCopy = Abc_ObjFanin0(pObj)->pCopy;
        else if ( Abc_ObjIsLatch(pObj) )
            Abc_ObjAddFanin( (pObj->pCopy = Abc_NtkCreateNode(pNtkNew)), Abc_ObjFanin0(pObj)->pCopy );
        else if ( Abc_ObjIsNode(pObj) )
        {
            Abc_NtkDupObj( pNtkNew, pObj, 1 );
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );
        }
        else assert( 0 );
    }
    Vec_PtrFree( vNodes );
    return pNtkNew;
}